

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_constant_inline.cpp
# Opt level: O3

void __thiscall
mocker::GlobalConstantInline::checkFunc(GlobalConstantInline *this,FunctionModule *func)

{
  _List_node_base *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _List_node_base *p_Var2;
  const_iterator cVar3;
  const_iterator cVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  RegMap<std::int64_t> *this_01;
  _func_int **pp_Var7;
  _List_node_base *p_Var8;
  shared_ptr<mocker::ir::IntLiteral> lit;
  shared_ptr<mocker::ir::Reg> globalReg;
  shared_ptr<mocker::ir::Addr> local_68;
  _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Reg>,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>,_std::__detail::_Identity,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_58;
  _List_node_base *local_50;
  _List_node_base *local_48;
  long local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_48 = (func->bbs).
             super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
             _M_impl._M_node.super__List_node_base._M_next;
  local_50 = (_List_node_base *)&func->bbs;
  if (local_48 != local_50) {
    local_58 = &(this->defined)._M_h;
    this_01 = &this->constant;
    do {
      p_Var2 = local_48 + 1;
      for (p_Var8 = local_48[1]._M_prev; p_Var8 != (_List_node_base *)&p_Var2->_M_prev;
          p_Var8 = p_Var8->_M_next) {
        p_Var1 = p_Var8[1]._M_next;
        if (*(int *)&p_Var1->_M_prev == 7) {
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var8[1]._M_prev;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          ir::dycGlobalReg((ir *)&local_40,(shared_ptr<mocker::ir::Addr> *)(p_Var1 + 1));
          if (local_40 != 0) {
            cVar3 = std::
                    _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Reg>,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>,_std::__detail::_Identity,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find(local_58,(key_type *)&local_40);
            std::
            _Hashtable<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>,std::allocator<std::shared_ptr<mocker::ir::Reg>>,std::__detail::_Identity,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::_M_emplace<std::shared_ptr<mocker::ir::Reg>&>
                      ((_Hashtable<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>,std::allocator<std::shared_ptr<mocker::ir::Reg>>,std::__detail::_Identity,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)local_58,(ir *)&local_40);
            if (cVar3.super__Node_iterator_base<std::shared_ptr<mocker::ir::Reg>,_true>._M_cur ==
                (__node_type *)0x0) {
              ir::detail::dyc_impl<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>const&>
                        (&local_68,(IntLiteral *)(p_Var1 + 2));
              if (local_68.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  == (element_type *)0x0) {
LAB_001609d5:
                cVar4 = std::
                        _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::find(&this_01->_M_h,(key_type *)&local_40);
                if (cVar4.
                    super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>,_true>
                    ._M_cur != (__node_type *)0x0) goto LAB_001609e7;
              }
              else {
                pp_Var7 = local_68.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr[1]._vptr_Addr;
LAB_001609c3:
                pmVar6 = std::__detail::
                         _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)this_01,(key_type *)&local_40);
                *pmVar6 = (mapped_type)pp_Var7;
              }
            }
            else {
              cVar4 = std::
                      _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find(&this_01->_M_h,(key_type *)&local_40);
              if (cVar4.
                  super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>,_true>
                  ._M_cur == (__node_type *)0x0) goto LAB_00160a10;
              ir::detail::dyc_impl<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>const&>
                        (&local_68,(IntLiteral *)(p_Var1 + 2));
              if (local_68.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  == (element_type *)0x0) goto LAB_001609d5;
              iVar5 = std::
                      _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find(&this_01->_M_h,(key_type *)&local_40);
              if (iVar5.
                  super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>,_true>
                  ._M_cur == (__node_type *)0x0) {
                std::__throw_out_of_range("_Map_base::at");
              }
              pp_Var7 = *(_func_int ***)
                         ((long)iVar5.
                                super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>,_true>
                                ._M_cur + 0x18);
              if (pp_Var7 ==
                  local_68.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  [1]._vptr_Addr) goto LAB_001609c3;
LAB_001609e7:
              iVar5 = std::
                      _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find(&this_01->_M_h,(key_type *)&local_40);
              std::
              _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::erase(&this_01->_M_h,
                      (const_iterator)
                      iVar5.
                      super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>,_true>
                      ._M_cur);
            }
            if (local_68.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_68.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
LAB_00160a10:
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
        }
      }
      local_48 = local_48->_M_next;
    } while (local_48 != local_50);
  }
  return;
}

Assistant:

void GlobalConstantInline::checkFunc(const ir::FunctionModule &func) {
  for (auto &bb : func.getBBs()) {
    for (auto &inst : bb.getInsts()) {
      auto store = ir::dyc<ir::Store>(inst);
      if (!store)
        continue;
      auto globalReg = ir::dycGlobalReg(store->getAddr());
      if (!globalReg)
        continue;

      bool firstTime = !isIn(defined, globalReg);
      defined.emplace(globalReg);
      if (!firstTime && !isIn(constant, globalReg))
        continue;

      auto lit = ir::dyc<ir::IntLiteral>(store->getVal());
      if (!lit) {
        if (isIn(constant, globalReg))
          constant.erase(constant.find(globalReg));
        continue;
      }

      if (!firstTime && constant.at(globalReg) != lit->getVal()) {
        constant.erase(constant.find(globalReg));
        continue;
      }
      constant[globalReg] = lit->getVal();
    }
  }
}